

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

bool __thiscall ON_wString::StartsWith(ON_wString *this,wchar_t *wszSub)

{
  wchar_t *pwVar1;
  ulong uVar2;
  size_t sVar3;
  ON_Internal_Empty_wString *pOVar4;
  ulong uVar5;
  
  sVar3 = wcslen(wszSub);
  if (sVar3 != 0) {
    pwVar1 = this->m_s;
    pOVar4 = &empty_wstring;
    if (pwVar1 != (wchar_t *)0x0) {
      pOVar4 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
    }
    if ((sVar3 <= (ulong)(long)(pOVar4->header).string_length) && (*pwVar1 == *wszSub)) {
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (sVar3 == uVar5) break;
        uVar2 = uVar5 + 1;
      } while (pwVar1[uVar5] == wszSub[uVar5]);
      return sVar3 <= uVar5;
    }
  }
  return false;
}

Assistant:

bool ON_wString::StartsWith(const wchar_t* wszSub) const
{
  const auto lenSub = wcslen(wszSub);
  if (0 == lenSub)
    return false;

  if (lenSub > Header()->string_length)
    return false;

  for (int i = 0; i < lenSub; i++)
  {
    if (m_s[i] != wszSub[i])
      return false;
  }

  return true;
}